

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.hpp
# Opt level: O2

void __thiscall
duckdb::Relation::Relation
          (Relation *this,shared_ptr<duckdb::ClientContext,_true> *context_p,RelationType type)

{
  shared_ptr<duckdb::ClientContext,_true> local_30;
  
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation = (_func_int **)&PTR__Relation_01780fb0;
  (this->context).internal.
  super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->context).internal.
  super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->type = type;
  (this->alias)._M_dataplus._M_p = (pointer)&(this->alias).field_2;
  (this->alias)._M_string_length = 0;
  (this->alias).field_2._M_local_buf[0] = '\0';
  (this->external_dependencies).
  super_vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->external_dependencies).
  super_vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->external_dependencies).
  super_vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  make_shared_ptr<duckdb::ClientContextWrapper,duckdb::shared_ptr<duckdb::ClientContext,true>const&>
            (&local_30);
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator=
            (&this->context,(shared_ptr<duckdb::ClientContextWrapper,_true> *)&local_30);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.internal.
              super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Relation(const shared_ptr<ClientContext> &context_p, const RelationType type) : type(type) {
		context = make_shared_ptr<ClientContextWrapper>(context_p);
	}